

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orthogonal_regions.hpp
# Opt level: O1

void afsm::orthogonal::detail::invoke_nth<1ul>::
     collect_events<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::work,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
               (tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::work,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
                *regions,event_set *events)

{
  event_set evts;
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  _Stack_48;
  
  invoke_nth<0ul>::
  collect_events<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::work,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
            (regions,events);
  afsm::detail::
  state_machine_base_impl<afsm::test::ortho_sm_def::on::error,_afsm::none,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
  ::current_handled_events
            ((event_set *)&_Stack_48,
             (state_machine_base_impl<afsm::test::ortho_sm_def::on::error,_afsm::none,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
              *)regions);
  std::
  _Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<afsm::detail::event_base::id_type_const*>>
            ((_Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              *)events,
             (_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)
             _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)
             &_Stack_48._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&_Stack_48);
  return;
}

Assistant:

static void
    collect_events( Regions const& regions, event_set& events )
    {
        previous::collect_events(regions, events);
        auto const& region = ::std::get<index>(regions);
        event_set evts = region.current_handled_events();
        events.insert(evts.begin(), evts.end());
    }